

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_header.c
# Opt level: O1

exr_result_t scratch_seq_read(_internal_exr_seq_scratch *scr,void *buf,uint64_t sz)

{
  exr_const_context_t_conflict p_Var1;
  int64_t iVar2;
  exr_result_t eVar3;
  exr_result_t eVar4;
  long lVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  ulong uVar8;
  int64_t nread;
  int64_t local_48;
  uint64_t *local_40;
  uint64_t local_38;
  
  local_38 = sz;
  if (sz == 0) {
    eVar3 = -1;
    uVar7 = 0;
  }
  else {
    local_40 = &scr->fileoff;
    eVar3 = -1;
    uVar7 = 0;
    do {
      uVar8 = scr->navail;
      if ((long)uVar8 < 1) {
        if (sz < 0x1000) {
          local_48 = 0;
          p_Var1 = scr->ctxt;
          uVar8 = p_Var1->file_size;
          if ((long)uVar8 < 1) {
            uVar6 = 1;
          }
          else {
            uVar6 = uVar8 - scr->fileoff;
            if (scr->fileoff + 0x1000 <= uVar8) {
              uVar6 = 0x1000;
            }
          }
          eVar3 = (*p_Var1->do_read)(p_Var1,scr->scratch,uVar6,local_40,&local_48,
                                     EXR_ALLOW_SHORT_READ);
          iVar2 = local_48;
          if (local_48 < 1) {
            if (local_48 == 0) {
              eVar3 = (*scr->ctxt->report_error)
                                (scr->ctxt,10,"End of file attempting to read header");
            }
          }
          else {
            scr->navail = local_48;
            scr->curpos = 0;
          }
          if (iVar2 < 1) break;
        }
        else {
          local_48 = 0;
          eVar3 = (*scr->ctxt->do_read)
                            (scr->ctxt,buf,sz & 0xfffffffffffff000,local_40,&local_48,
                             EXR_MUST_READ_ALL);
          lVar5 = 0;
          if (0 < local_48) {
            lVar5 = local_48;
          }
          uVar7 = uVar7 + lVar5;
          if (local_48 < 1) break;
          sz = sz - lVar5;
          buf = (void *)((long)buf + lVar5);
        }
      }
      else {
        if (sz < uVar8) {
          uVar8 = sz;
        }
        memcpy(buf,scr->scratch + scr->curpos,uVar8);
        scr->curpos = scr->curpos + uVar8;
        scr->navail = scr->navail - uVar8;
        sz = sz - uVar8;
        buf = (void *)((long)buf + uVar8);
        uVar7 = uVar7 + uVar8;
      }
    } while (sz != 0);
  }
  eVar4 = 10;
  if (uVar7 == local_38) {
    eVar4 = 0;
  }
  if (eVar3 != -1) {
    eVar4 = eVar3;
  }
  return eVar4;
}

Assistant:

static exr_result_t
scratch_seq_read (struct _internal_exr_seq_scratch* scr, void* buf, uint64_t sz)
{
    uint8_t*     outbuf  = buf;
    uint64_t     nCopied = 0;
    uint64_t     notdone = sz;
    exr_result_t rv      = -1;

    while (notdone > 0)
    {
        if (scr->navail > 0)
        {
            uint64_t nLeft = (uint64_t) scr->navail;
            uint64_t nCopy = notdone;
            if (nCopy > nLeft) nCopy = nLeft;
            memcpy (outbuf, scr->scratch + scr->curpos, nCopy);
            scr->curpos += nCopy;
            scr->navail -= (int64_t) nCopy;
            notdone -= nCopy;
            outbuf += nCopy;
            nCopied += nCopy;
        }
        else if (notdone >= SCRATCH_BUFFER_SIZE)
        {
            uint64_t nPages  = notdone / SCRATCH_BUFFER_SIZE;
            int64_t  nread   = 0;
            uint64_t nToRead = nPages * SCRATCH_BUFFER_SIZE;
            rv               = scr->ctxt->do_read (
                scr->ctxt,
                outbuf,
                nToRead,
                &(scr->fileoff),
                &nread,
                EXR_MUST_READ_ALL);
            if (nread > 0)
            {
                notdone -= (uint64_t) nread;
                outbuf += nread;
                nCopied += (uint64_t) nread;
            }
            else { break; }
        }
        else
        {
            int64_t nread = 0;
            uint64_t toread = SCRATCH_BUFFER_SIZE;

            if (scr->ctxt->file_size > 0)
            {
                if ((scr->fileoff + SCRATCH_BUFFER_SIZE) > scr->ctxt->file_size)
                {
                    toread = scr->ctxt->file_size - scr->fileoff;
                }
            }
            else
            {
                /*
                 * hrm, stream only with no known size, just read 1 byte at a
                 * time to be safer
                 */
                toread = 1;
            }

            rv = scr->ctxt->do_read (
                scr->ctxt,
                scr->scratch,
                toread,
                &(scr->fileoff),
                &nread,
                EXR_ALLOW_SHORT_READ);
            if (nread > 0)
            {
                scr->navail = nread;
                scr->curpos = 0;
            }
            else
            {
                if (nread == 0)
                    rv = scr->ctxt->report_error (
                        scr->ctxt,
                        EXR_ERR_READ_IO,
                        "End of file attempting to read header");
                break;
            }
        }
    }
    if (rv == -1)
    {
        if (nCopied == sz)
            rv = EXR_ERR_SUCCESS;
        else
            rv = EXR_ERR_READ_IO;
    }
    return rv;
}